

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O0

void evaluation_compiletime<1l,viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>>
     ::
     apply<viennamath::ct_vector_3<viennamath::ct_constant<4l>,viennamath::ct_constant<6l>,viennamath::ct_constant<8l>>>
               (ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>_>
                *e,ct_vector_3<viennamath::ct_constant<4L>,_viennamath::ct_constant<6L>,_viennamath::ct_constant<8L>_>
                   *v,double ref_solution)

{
  ostream *poVar1;
  type tVar2;
  numeric_type nVar3;
  type local_30;
  rt_expr<viennamath::rt_expression_interface<double>_> local_28;
  expr temp;
  double ref_solution_local;
  ct_vector_3<viennamath::ct_constant<4L>,_viennamath::ct_constant<6L>,_viennamath::ct_constant<8L>_>
  *v_local;
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>_>
  *e_local;
  
  temp.rt_expr_._M_ptr =
       (auto_ptr<const_viennamath::rt_expression_interface<double>_>)
       (auto_ptr<const_viennamath::rt_expression_interface<double>_>)ref_solution;
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0x11);
  tVar2 = viennamath::
          eval<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>,viennamath::ct_vector_3<viennamath::ct_constant<4l>,viennamath::ct_constant<6l>,viennamath::ct_constant<8l>>>
                    (e,v);
  std::ostream::operator<<(&std::cout,tVar2);
  local_30 = viennamath::
             eval<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>,viennamath::ct_vector_3<viennamath::ct_constant<4l>,viennamath::ct_constant<6l>,viennamath::ct_constant<8l>>>
                       (e,v);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_28,&local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"(should: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)temp.rt_expr_._M_ptr);
  poVar1 = std::operator<<(poVar1,", is: ");
  nVar3 = viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator()
                    (&local_28,1.0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,nVar3);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  nVar3 = viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator()
                    (&local_28,1.0);
  fuzzy_check(nVar3,(double)temp.rt_expr_._M_ptr);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_28);
  return;
}

Assistant:

static void apply(E const & e, VectorType const & v, double ref_solution)
  {
    std::cout.precision(17);
    std::cout << viennamath::eval(e, v);
    viennamath::expr temp(viennamath::eval(e, v));
    std::cout <<  "(should: " << ref_solution << ", is: " << temp(1.0) << ")" << std::endl;
    fuzzy_check(temp(1.0), ref_solution);
  }